

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::char_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          align_spec *spec,char_writer *f)

{
  byte bVar1;
  uint uVar2;
  type __s;
  char __tmp;
  size_t __len_1;
  ulong __n;
  type pcVar3;
  size_t __len;
  ulong uVar4;
  
  uVar2 = spec->width_;
  uVar4 = (ulong)uVar2;
  if (uVar4 < 2) {
    pcVar3 = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                       ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,1);
    *pcVar3 = f->value;
    return;
  }
  __s = internal::reserve<fmt::v5::internal::basic_buffer<char>>
                  ((back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> *)this,uVar4);
  bVar1 = (byte)spec->fill_;
  uVar4 = uVar4 - 1;
  pcVar3 = __s;
  if (spec->align_ == ALIGN_CENTER) {
    __n = uVar4 >> 1;
    if (uVar2 != 2) {
      pcVar3 = __s + __n;
      memset(__s,(uint)bVar1,__n);
    }
    *pcVar3 = f->value;
    uVar4 = uVar4 - __n;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      memset(__s,(uint)bVar1,uVar4);
      __s[uVar4] = f->value;
      return;
    }
    *__s = f->value;
  }
  memset(pcVar3 + 1,(uint)bVar1,uVar4);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }